

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O1

void __thiscall
Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>::CreateResourceMapping
          (RenderDeviceBase<Diligent::EngineVkImplTraits> *this,
          ResourceMappingCreateInfo *ResMappingCI,IResourceMapping **ppMapping)

{
  ResourceMappingEntry *pRVar1;
  long lVar2;
  IMemoryAllocator *CtorArgs;
  ResourceMappingImpl *pRVar3;
  long lVar4;
  ulong uVar5;
  string msg;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined4 local_38;
  
  if (ppMapping == (IResourceMapping **)0x0) {
    FormatString<char[22]>((string *)local_58,(char (*) [22])"Null pointer provided");
    DebugAssertionFailed
              ((Char *)local_58._0_8_,"CreateResourceMapping",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
               ,0xeb);
    if ((undefined1 *)local_58._0_8_ != local_48) {
      operator_delete((void *)local_58._0_8_,local_48._0_8_ + 1);
    }
  }
  else {
    if (*ppMapping != (IResourceMapping *)0x0) {
      FormatString<char[64]>
                ((string *)local_58,
                 (char (*) [64])"Overwriting reference to existing object may cause memory leaks");
      DebugAssertionFailed
                ((Char *)local_58._0_8_,"CreateResourceMapping",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
                 ,0xee);
      if ((undefined1 *)local_58._0_8_ != local_48) {
        operator_delete((void *)local_58._0_8_,local_48._0_8_ + 1);
      }
    }
    if ((ResMappingCI->pEntries != (ResourceMappingEntry *)0x0) && (ResMappingCI->NumEntries == 0))
    {
      FormatString<char[89]>
                ((string *)local_58,
                 (char (*) [89])
                 "Starting with API253010, the number of entries is defined through the NumEntries member."
                );
      DebugAssertionFailed
                ((Char *)local_58._0_8_,"CreateResourceMapping",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
                 ,0xef);
      if ((undefined1 *)local_58._0_8_ != local_48) {
        operator_delete((void *)local_58._0_8_,local_48._0_8_ + 1);
      }
    }
    local_58._0_8_ = &this->m_ResMappingAllocator;
    local_58._8_8_ = 0;
    local_48._0_8_ = "ResourceMappingImpl instance";
    local_48._8_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
    ;
    local_38 = 0xf1;
    CtorArgs = GetRawAllocator();
    pRVar3 = MakeNewRCObj<Diligent::ResourceMappingImpl,Diligent::FixedBlockMemoryAllocator>::
             operator()((MakeNewRCObj<Diligent::ResourceMappingImpl,Diligent::FixedBlockMemoryAllocator>
                         *)local_58,CtorArgs);
    (**(pRVar3->super_ObjectBase<Diligent::IResourceMapping>).
       super_RefCountedObject<Diligent::IResourceMapping>.super_IResourceMapping.super_IObject.
       _vptr_IObject)(pRVar3,IID_ResourceMapping,ppMapping);
    if ((ResMappingCI->pEntries != (ResourceMappingEntry *)0x0) && (ResMappingCI->NumEntries != 0))
    {
      lVar4 = 8;
      uVar5 = 0;
      do {
        pRVar1 = ResMappingCI->pEntries;
        lVar2 = *(long *)((long)pRVar1 + lVar4 + -8);
        if ((lVar2 == 0) || (*(long *)((long)&pRVar1->Name + lVar4) == 0)) {
          FormatString<char[134]>
                    ((string *)local_58,
                     (char (*) [134])
                     "Name and pObject must not be null. Note that starting with API253010, the number of entries is defined through the NumEntries member."
                    );
          DebugAssertionFailed
                    ((Char *)local_58._0_8_,"CreateResourceMapping",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
                     ,0xfb);
          if ((undefined1 *)local_58._0_8_ != local_48) {
            operator_delete((void *)local_58._0_8_,(ulong)(local_48._0_8_ + 1));
          }
        }
        else {
          (*((*ppMapping)->super_IObject)._vptr_IObject[5])
                    (*ppMapping,lVar2,(ulong)*(uint *)((long)&pRVar1->pObject + lVar4),
                     (long)&pRVar1->Name + lVar4,1,1);
        }
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0x18;
      } while (uVar5 < ResMappingCI->NumEntries);
    }
  }
  return;
}

Assistant:

CreateResourceMapping(const ResourceMappingCreateInfo& ResMappingCI, IResourceMapping** ppMapping) override final
    {
        DEV_CHECK_ERR(ppMapping != nullptr, "Null pointer provided");
        if (ppMapping == nullptr)
            return;
        DEV_CHECK_ERR(*ppMapping == nullptr, "Overwriting reference to existing object may cause memory leaks");
        DEV_CHECK_ERR(ResMappingCI.pEntries == nullptr || ResMappingCI.NumEntries != 0, "Starting with API253010, the number of entries is defined through the NumEntries member.");

        ResourceMappingImpl* pResourceMapping{NEW_RC_OBJ(m_ResMappingAllocator, "ResourceMappingImpl instance", ResourceMappingImpl)(GetRawAllocator())};
        pResourceMapping->QueryInterface(IID_ResourceMapping, reinterpret_cast<IObject**>(ppMapping));
        if (ResMappingCI.pEntries != nullptr)
        {
            for (Uint32 i = 0; i < ResMappingCI.NumEntries; ++i)
            {
                const ResourceMappingEntry& Entry = ResMappingCI.pEntries[i];
                if (Entry.Name != nullptr && Entry.pObject != nullptr)
                    (*ppMapping)->AddResourceArray(Entry.Name, Entry.ArrayIndex, &Entry.pObject, 1, true);
                else
                    DEV_ERROR("Name and pObject must not be null. Note that starting with API253010, the number of entries is defined through the NumEntries member.");
            }
        }
    }